

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

void slab_arena_destroy(slab_arena *arena)

{
  void *pvVar1;
  void *pvVar2;
  void *__e;
  slab_arena *psVar3;
  slab_arena *addr;
  size_t sVar4;
  bool bVar5;
  
  sVar4 = 0;
  addr = arena;
  while( true ) {
    do {
      pvVar1 = (arena->cache).next;
      psVar3 = (slab_arena *)((ulong)pvVar1 & 0xffffffffffff0000);
      if (psVar3 == (slab_arena *)0x0) {
        bVar5 = false;
        addr = (slab_arena *)0x0;
      }
      else {
        LOCK();
        pvVar2 = (arena->cache).next;
        if (pvVar1 == pvVar2) {
          (arena->cache).next =
               (void *)((ulong)pvVar1 & 0xffff | (ulong)(psVar3->cache).next & 0xffffffffffff0000);
          pvVar2 = pvVar1;
        }
        UNLOCK();
        bVar5 = pvVar1 != pvVar2;
        if (!bVar5) {
          addr = psVar3;
        }
      }
    } while (bVar5);
    if (addr == (slab_arena *)0x0) break;
    psVar3 = (slab_arena *)arena->arena;
    if (((psVar3 == (slab_arena *)0x0) || (addr < psVar3)) ||
       ((slab_arena *)((long)&(psVar3->cache).next + arena->prealloc) <= addr)) {
      munmap_checked(addr,(ulong)arena->slab_size);
    }
    sVar4 = sVar4 + arena->slab_size;
  }
  if (arena->arena != (void *)0x0) {
    munmap_checked(arena->arena,arena->prealloc);
  }
  if (sVar4 != arena->used) {
    __assert_fail("total == arena->used",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0xe9,"void slab_arena_destroy(struct slab_arena *)");
  }
  return;
}

Assistant:

void
slab_arena_destroy(struct slab_arena *arena)
{
	void *ptr;
	size_t total = 0;
	while ((ptr = lf_lifo_pop(&arena->cache))) {
		if (arena->arena == NULL || ptr < arena->arena ||
		    ptr >= arena->arena + arena->prealloc) {
			munmap_checked(ptr, arena->slab_size);
		}
		total += arena->slab_size;
	}
	if (arena->arena)
		munmap_checked(arena->arena, arena->prealloc);

	(void)total;
	assert(total == arena->used);
}